

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O0

ssize_t nextChar(iovec *curr,iovec *cont,size_t clen,int match)

{
  ssize_t sVar1;
  iovec *local_38;
  ssize_t part;
  size_t sStack_28;
  int match_local;
  size_t clen_local;
  iovec *cont_local;
  iovec *curr_local;
  
  curr_local = (iovec *)mpt_memchr(curr,1,match);
  if ((long)curr_local < 0) {
    if ((clen == 0) || (sVar1 = mpt_memchr(cont,clen,match), sVar1 < 0)) {
      local_38 = (iovec *)curr->iov_len;
      sStack_28 = clen;
      clen_local = (size_t)cont;
      while (sStack_28 != 0) {
        local_38 = (iovec *)((long)&local_38->iov_base + *(long *)(clen_local + 8));
        sStack_28 = sStack_28 - 1;
        clen_local = clen_local + 0x10;
      }
      curr_local = local_38;
    }
    else {
      curr_local = (iovec *)(curr->iov_len + sVar1);
    }
  }
  return (ssize_t)curr_local;
}

Assistant:

static ssize_t nextChar(const struct iovec *curr, const struct iovec *cont, size_t clen, int match)
{
	ssize_t part;
	
	if ((part = mpt_memchr(curr, 1, match)) >= 0) {
		return part;
	}
	if (clen && (part = mpt_memchr(cont, clen, match)) >= 0) {
		return curr->iov_len + part;
	}
	part = curr->iov_len;
	
	while (clen--)
		part += (cont++)->iov_len;
	
	return part;
}